

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UppercaseSequance.cpp
# Opt level: O0

void __thiscall UppercaseSequance::~UppercaseSequance(UppercaseSequance *this)

{
  UppercaseSequance *this_local;
  
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

UppercaseSequance::~UppercaseSequance(void)
{
	
}